

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonteCarloPricer.h
# Opt level: O2

PriceCI * __thiscall
MonteCarloPricer::priceClassic<BullSpread>
          (PriceCI *__return_storage_ptr__,MonteCarloPricer *this,BlackScholesModel *model,
          BullSpread *option)

{
  PriceCI *pPVar1;
  int i;
  int iVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  double dVar4;
  double dVar5;
  ulong extraout_XMM0_Qb;
  double dVar6;
  double dVar7;
  double local_60;
  double local_58;
  PriceCI *local_50;
  double local_48;
  ulong uStack_40;
  
  dVar7 = 0.0;
  dVar6 = 0.0;
  local_50 = __return_storage_ptr__;
  for (iVar2 = 0; iVar2 < this->num_sims; iVar2 = iVar2 + 1) {
    local_60 = Option::getMaturity((Option *)option);
    local_58 = BlackScholesModel::generatePrice(model,&local_60);
    (*(option->super_PathIndependentOption).super_Option._vptr_Option[1])(option,&local_58);
    dVar7 = dVar7 + extraout_XMM0_Qa;
    dVar6 = dVar6 + extraout_XMM0_Qa * extraout_XMM0_Qa;
  }
  dVar3 = (double)this->num_sims;
  dVar7 = dVar7 / dVar3;
  local_48 = BlackScholesModel::getRiskFreeRate(model);
  local_48 = -local_48;
  uStack_40 = extraout_XMM0_Qb ^ 0x8000000000000000;
  dVar4 = Option::getMaturity((Option *)option);
  local_58 = exp(dVar4 * local_48);
  local_58 = local_58 * dVar7;
  dVar4 = BlackScholesModel::getRiskFreeRate(model);
  dVar5 = Option::getMaturity((Option *)option);
  local_60 = exp(dVar5 * dVar4 * -2.0);
  pPVar1 = local_50;
  local_60 = local_60 * (dVar6 / dVar3 - dVar7 * dVar7);
  PriceCI::PriceCI(local_50,&local_58,&local_60,&this->num_sims);
  return pPVar1;
}

Assistant:

inline PriceCI MonteCarloPricer::priceClassic(BlackScholesModel const& model, pathIndependentOption const& option) const
{
	double payoff, payoff_sum = 0.0, payoff_sq_mean = 0.0;
	for (int i = 0; i < num_sims; i++) {
		payoff = option.payoff(model.generatePrice(option.getMaturity()));
		payoff_sum += payoff;
		payoff_sq_mean += payoff * payoff;
	}
	double payoff_mean = payoff_sum / static_cast<double>(num_sims);
	double payoff_std = (payoff_sq_mean / static_cast<double>(num_sims)) - payoff_mean * payoff_mean;
	payoff_mean *= exp(-model.getRiskFreeRate() * option.getMaturity());
	payoff_std *= exp(-2 * model.getRiskFreeRate() * option.getMaturity());
	return { payoff_mean, payoff_std, num_sims };
}